

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O0

bool burst::detail::
     collect_impl<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
               double *last,long *param_3,long *param_4)

{
  anon_class_40_5_aef1ef96 __f;
  initializer_list<int> iVar1;
  pair<long_*,_long> pVar2;
  long local_150;
  long local_140;
  long local_130;
  long local_120;
  long local_110;
  long local_100;
  long local_f0;
  long local_e0;
  int local_d8 [8];
  iterator local_b8;
  undefined8 local_b0;
  anon_class_40_5_aef1ef96 local_a8;
  long **local_80;
  long lStack_78;
  long local_70;
  undefined1 *puStack_68;
  bool *local_60;
  double *local_58;
  double *local_50;
  bool local_41;
  unsigned_long uStack_40;
  bool is_sorted;
  unsigned_long previous;
  long *plStack_30;
  int radix_value_range;
  long *maximums_local;
  long (*counters_local) [256];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Stack_18;
  compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> map_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first_local;
  
  previous._4_4_ = 0x100;
  plStack_30 = param_4;
  maximums_local = param_3;
  _Stack_18._M_current = last;
  uStack_40 = std::numeric_limits<unsigned_long>::min();
  local_41 = true;
  local_58 = _Stack_18._M_current;
  local_80 = &maximums_local;
  lStack_78 = (long)&counters_local + 6;
  local_70 = (long)&counters_local + 5;
  puStack_68 = (undefined1 *)&stack0xffffffffffffffc0;
  local_60 = &local_41;
  __f.map = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)lStack_78;
  __f.counters = (long (**) [256])local_80;
  __f.radix = (low_byte_fn *)local_70;
  __f.previous = (unsigned_long *)puStack_68;
  __f.is_sorted = local_60;
  local_50 = first._M_current;
  std::
  for_each<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::detail::collect_impl<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>)::_lambda(auto:1_const&)_1_>
            (&local_a8,first,_Stack_18,__f);
  pVar2 = partial_sum_max<long*,long*>(maximums_local,maximums_local + 0x100,maximums_local);
  local_e0 = pVar2.second;
  *plStack_30 = local_e0;
  local_d8[0] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x100,maximums_local + 0x200,maximums_local + 0x100);
  local_f0 = pVar2.second;
  plStack_30[1] = local_f0;
  local_d8[1] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x200,maximums_local + 0x300,maximums_local + 0x200);
  local_100 = pVar2.second;
  plStack_30[2] = local_100;
  local_d8[2] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x300,maximums_local + 0x400,maximums_local + 0x300);
  local_110 = pVar2.second;
  plStack_30[3] = local_110;
  local_d8[3] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x400,maximums_local + 0x500,maximums_local + 0x400);
  local_120 = pVar2.second;
  plStack_30[4] = local_120;
  local_d8[4] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x500,maximums_local + 0x600,maximums_local + 0x500);
  local_130 = pVar2.second;
  plStack_30[5] = local_130;
  local_d8[5] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x600,maximums_local + 0x700,maximums_local + 0x600);
  local_140 = pVar2.second;
  plStack_30[6] = local_140;
  local_d8[6] = 0;
  pVar2 = partial_sum_max<long*,long*>
                    (maximums_local + 0x700,maximums_local + 0x800,maximums_local + 0x700);
  local_150 = pVar2.second;
  plStack_30[7] = local_150;
  local_d8[7] = 0;
  local_b8 = local_d8;
  local_b0 = 8;
  iVar1._M_len = 8;
  iVar1._M_array = local_b8;
  dummy(iVar1);
  return (bool)(local_41 & 1);
}

Assistant:

bool collect_impl (ForwardIterator first, ForwardIterator last, Map map, Radix radix, RandomAccessIterator1 counters, RandomAccessIterator2 maximums, std::index_sequence<Radices...>)
        {
            using value_type = iterator_value_t<ForwardIterator>;
            constexpr auto radix_value_range = radix_sort_traits<value_type, Map, Radix>::radix_value_range;

            auto previous = std::numeric_limits<invoke_result_t<Map, value_type>>::min();
            auto is_sorted = true;
            std::for_each(first, last,
                [& counters, & map, & radix, & previous, & is_sorted] (const auto & preimage)
                {
                    auto image = map(preimage);
                    is_sorted &= (image >= previous);
                    previous = image;

                    BURST_EXPAND_VARIADIC(++counters[Radices][nth_radix(Radices, radix)(image)]);
                });

            BURST_EXPAND_VARIADIC(maximums[Radices] = partial_sum_max(counters[Radices], counters[Radices] + radix_value_range, counters[Radices]).second);

            return is_sorted;
        }